

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void __thiscall
pstore::broker::command_processor::command_processor
          (command_processor *this,uint num_read_threads,
          not_null<pstore::maybe<pstore::http::server_status,_void>_*> http_status,
          not_null<std::atomic<bool>_*> uptime_done,seconds delete_threshold)

{
  bool bVar1;
  
  this->_vptr_command_processor = (_func_int **)&PTR__command_processor_0018c120;
  (this->commands_done_)._M_base._M_i = false;
  (this->http_status_).ptr_ = http_status.ptr_;
  (this->uptime_done_).ptr_ = uptime_done.ptr_;
  (this->delete_threshold_).__r = delete_threshold.__r;
  (this->scavenger_).mut_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->scavenger_).mut_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->scavenger_).mut_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->scavenger_).mut_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->scavenger_).mut_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->scavenger_).ptr_.super___weak_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->scavenger_).ptr_.super___weak_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
  ::message_queue(&this->messages_);
  *(undefined8 *)((long)&(this->cmds_mut_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->cmds_mut_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->cmds_mut_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->cmds_mut_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->cmds_mut_).super___mutex_base._M_mutex + 8) = 0;
  (this->cmds_)._M_h._M_buckets = &(this->cmds_)._M_h._M_single_bucket;
  (this->cmds_)._M_h._M_bucket_count = 1;
  (this->cmds_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->cmds_)._M_h._M_element_count = 0;
  (this->cmds_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->cmds_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cmds_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->num_read_threads_ = num_read_threads;
  this->commits_ = 0;
  bVar1 = std::
          is_sorted<std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>const*,bool(*)(std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>const&,std::tuple<char_const*,std::function<void(pstore::broker::command_processor*,pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)>>const&)>
                    ((tuple<const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
                      *)&commands_,
                     (tuple<const_char_*,_std::function<void_(pstore::broker::command_processor_*,_const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>_>
                      *)&getgc::gc,command_entry_compare);
  if (bVar1) {
    return;
  }
  assert_failed("std::is_sorted (std::begin (commands_), std::end (commands_), command_entry_compare)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/broker/command.cpp"
                ,0x4d);
}

Assistant:

command_processor::command_processor (
            unsigned const num_read_threads,
            gsl::not_null<maybe<http::server_status> *> const http_status,
            gsl::not_null<std::atomic<bool> *> const uptime_done,
            std::chrono::seconds const delete_threshold)
                : http_status_{http_status}
                , uptime_done_{uptime_done}
                , delete_threshold_{delete_threshold}
                , num_read_threads_{num_read_threads} {
            PSTORE_ASSERT (std::is_sorted (std::begin (commands_), std::end (commands_),
                                           command_entry_compare));
        }